

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall
CSmoothTime::Update(CSmoothTime *this,CGraph *pGraph,int64 Target,int TimeLeft,int AdjustDirection)

{
  float *pfVar1;
  int in_ECX;
  CGraph *in_RSI;
  long in_RDI;
  int in_R8D;
  int IsSpike;
  int UpdateTimer;
  int in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 1;
  if (in_ECX < 0) {
    in_stack_ffffffffffffffd8 = 0;
    if (in_ECX < -0x32) {
      in_stack_ffffffffffffffd8 = 1;
      *(int *)(in_RDI + 0x82c) = *(int *)(in_RDI + 0x82c) + 5;
      if (0x32 < *(int *)(in_RDI + 0x82c)) {
        *(undefined4 *)(in_RDI + 0x82c) = 0x32;
      }
    }
    if ((in_stack_ffffffffffffffd8 == 0) || (0xe < *(int *)(in_RDI + 0x82c))) {
      CGraph::Add(in_RSI,(float)in_ECX,1.0,0.3,0.3);
      *(int *)(in_RDI + 0x830) = *(int *)(in_RDI + 0x830) + 0x32;
      pfVar1 = (float *)(in_RDI + 0x834 + (long)in_R8D * 4);
      if (*pfVar1 <= 30.0 && *pfVar1 != 30.0) {
        *(float *)(in_RDI + 0x834 + (long)in_R8D * 4) =
             *(float *)(in_RDI + 0x834 + (long)in_R8D * 4) * 2.0;
      }
    }
    else {
      iVar2 = 0;
      CGraph::Add(in_RSI,(float)in_ECX,1.0,1.0,0.3);
      *(int *)(in_RDI + 0x830) = *(int *)(in_RDI + 0x830) + 10;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x82c) != 0) {
      *(int *)(in_RDI + 0x82c) = *(int *)(in_RDI + 0x82c) + -1;
    }
    CGraph::Add(in_RSI,(float)in_ECX,0.3,1.0,0.3);
    *(float *)(in_RDI + 0x834 + (long)in_R8D * 4) =
         *(float *)(in_RDI + 0x834 + (long)in_R8D * 4) * 0.95;
    pfVar1 = (float *)(in_RDI + 0x834 + (long)in_R8D * 4);
    if (*pfVar1 <= 2.0 && *pfVar1 != 2.0) {
      *(undefined4 *)(in_RDI + 0x834 + (long)in_R8D * 4) = 0x40000000;
    }
  }
  if (iVar2 != 0) {
    UpdateInt((CSmoothTime *)CONCAT44(in_ECX,in_R8D),CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  }
  *(int *)(in_RDI + 0x830) = *(int *)(in_RDI + 0x830) - (*(int *)(in_RDI + 0x830) / 100 + 1);
  return;
}

Assistant:

void CSmoothTime::Update(CGraph *pGraph, int64 Target, int TimeLeft, int AdjustDirection)
{
	int UpdateTimer = 1;

	if(TimeLeft < 0)
	{
		int IsSpike = 0;
		if(TimeLeft < -50)
		{
			IsSpike = 1;

			m_SpikeCounter += 5;
			if(m_SpikeCounter > 50)
				m_SpikeCounter = 50;
		}

		if(IsSpike && m_SpikeCounter < 15)
		{
			// ignore this ping spike
			UpdateTimer = 0;
			pGraph->Add(TimeLeft, 1,1,0.3f); // yellow
			m_BadnessScore += 10;
		}
		else
		{
			pGraph->Add(TimeLeft, 1,0.3f,0.3f); // red
			m_BadnessScore += 50;
			if(m_aAdjustSpeed[AdjustDirection] < 30.0f)
				m_aAdjustSpeed[AdjustDirection] *= 2.0f;
		}
	}
	else
	{
		if(m_SpikeCounter)
			m_SpikeCounter--;

		pGraph->Add(TimeLeft, 0.3f,1,0.3f); // green

		m_aAdjustSpeed[AdjustDirection] *= 0.95f;
		if(m_aAdjustSpeed[AdjustDirection] < 2.0f)
			m_aAdjustSpeed[AdjustDirection] = 2.0f;
	}

	if(UpdateTimer)
		UpdateInt(Target);

	m_BadnessScore -= 1+m_BadnessScore/100;
}